

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Synth::storeChanValues(V2Synth *this,int chan)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  V2Sound *pVVar4;
  syVChan *para;
  V2Mod *pVVar5;
  float fVar6;
  float fVar7;
  bool local_59;
  float scale;
  int dest;
  V2Mod *mod;
  int i_1;
  int i;
  V2Voice *voice;
  V2Chan *cwork;
  float *cparaf;
  syVChan *cpara;
  V2Sound *patch;
  int chan_local;
  V2Synth *this_local;
  
  local_59 = 0xf < (uint)chan;
  if (local_59) {
    __assert_fail("chan >= 0 && chan < CHANS",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                  ,0xc26,"void V2Synth::storeChanValues(int)");
  }
  pVVar4 = getpatch(this,(uint)this->chans[chan].pgm);
  para = this->chansv + chan;
  iVar2 = this->voicemap[chan];
  for (mod._4_4_ = 0; mod._4_4_ < 0x1d; mod._4_4_ = mod._4_4_ + 1) {
    (&para->chanvol)[mod._4_4_] = (float)pVVar4->chan[mod._4_4_];
  }
  for (mod._0_4_ = 0; (int)mod < (int)(uint)pVVar4->modnum; mod._0_4_ = (int)mod + 1) {
    pVVar5 = pVVar4->modmatrix + (int)mod;
    iVar3 = pVVar5->dest - 0x3b;
    if ((-1 < iVar3) && (iVar3 < 0x1d)) {
      bVar1 = pVVar5->val;
      fVar7 = (&para->chanvol)[iVar3];
      fVar6 = getmodsource(this,this->voicesw + iVar2,chan,(uint)pVVar5->source);
      fVar7 = clamp<float>((((float)bVar1 - 64.0) / 64.0) * fVar6 + fVar7,0.0,128.0);
      (&para->chanvol)[iVar3] = fVar7;
    }
  }
  V2Chan::set(this->chansw + chan,para);
  return;
}

Assistant:

void storeChanValues(int chan)
    {
        assert(chan >= 0 && chan < CHANS);

        // get patch definition
        const V2Sound *patch = getpatch(chans[chan].pgm);

        // chan data
        syVChan *cpara = &chansv[chan];
        float *cparaf = (float *)cpara;
        V2Chan *cwork = &chansw[chan];
        V2Voice *voice = &voicesw[voicemap[chan]];

        // copy channel dependent data
        for (int i = 0; i < COUNTOF(patch->chan); i++)
            cparaf[i] = (float)patch->chan[i];

        // modulation matrix
        for (int i = 0; i < patch->modnum; i++)
        {
            const V2Mod *mod = &patch->modmatrix[i];
            int dest = mod->dest - COUNTOF(patch->voice);
            if (dest < 0 || dest >= COUNTOF(patch->chan))
                continue;

            float scale = (mod->val - 64.0f) / 64.0f;
            cparaf[dest] = clamp(cparaf[dest] + scale*getmodsource(voice, chan, mod->source), 0.0f, 128.0f);
        }

        cwork->set(cpara);
    }